

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O1

void SamplePuzzles(int64_t limit)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  void *table;
  void *index;
  result_type_conflict rVar5;
  long lVar6;
  ushort uVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  char grid [81];
  char local_88 [88];
  undefined1 auVar8 [16];
  
  table = MMapFile("grid.counts");
  index = MMapFile("grid.index");
  if (limit != 0) {
    do {
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)
                         (anonymous_namespace)::random_uint,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)(anonymous_namespace)::rng,
                         (param_type *)(anonymous_namespace)::random_uint);
      GetGrid(rVar5 % 0x339a6ca6180,index,table,local_88);
      bVar4 = TdokuMinimize(false,true,local_88);
      if (bVar4) {
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        lVar6 = 0;
        auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar13 = vpbroadcastq_avx512f(ZEXT816(0x51));
        auVar21[8] = 0x2e;
        auVar21._0_8_ = 0x2e2e2e2e2e2e2e2e;
        auVar21[9] = 0x2e;
        auVar21[10] = 0x2e;
        auVar21[0xb] = 0x2e;
        auVar21[0xc] = 0x2e;
        auVar21[0xd] = 0x2e;
        auVar21[0xe] = 0x2e;
        auVar21[0xf] = 0x2e;
        do {
          auVar14 = vmovdqa64_avx512f(auVar20);
          auVar20 = vpbroadcastq_avx512f();
          auVar15 = vporq_avx512f(auVar20,auVar11);
          auVar20 = vporq_avx512f(auVar20,auVar12);
          uVar1 = vpcmpuq_avx512f(auVar20,auVar13,1);
          bVar2 = (byte)uVar1;
          uVar1 = vpcmpuq_avx512f(auVar15,auVar13,1);
          bVar3 = (byte)uVar1;
          uVar7 = CONCAT11(bVar3,bVar2);
          auVar8 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(local_88 + lVar6));
          auVar9[1] = ((byte)(uVar7 >> 1) & 1) * auVar8[1];
          auVar9[0] = (bVar2 & 1) * auVar8[0];
          auVar9[2] = ((byte)(uVar7 >> 2) & 1) * auVar8[2];
          auVar9[3] = ((byte)(uVar7 >> 3) & 1) * auVar8[3];
          auVar9[4] = ((byte)(uVar7 >> 4) & 1) * auVar8[4];
          auVar9[5] = ((byte)(uVar7 >> 5) & 1) * auVar8[5];
          auVar9[6] = ((byte)(uVar7 >> 6) & 1) * auVar8[6];
          auVar9[7] = ((byte)(uVar7 >> 7) & 1) * auVar8[7];
          auVar9[8] = (bVar3 & 1) * auVar8[8];
          auVar9[9] = (bVar3 >> 1 & 1) * auVar8[9];
          auVar9[10] = (bVar3 >> 2 & 1) * auVar8[10];
          auVar9[0xb] = (bVar3 >> 3 & 1) * auVar8[0xb];
          auVar9[0xc] = (bVar3 >> 4 & 1) * auVar8[0xc];
          auVar9[0xd] = (bVar3 >> 5 & 1) * auVar8[0xd];
          auVar9[0xe] = (bVar3 >> 6 & 1) * auVar8[0xe];
          auVar9[0xf] = -((char)bVar3 >> 7) * auVar8[0xf];
          uVar1 = vpcmpb_avx512vl(auVar9,auVar21,4);
          auVar20 = vpmovm2d_avx512dq(uVar1);
          auVar20 = vpsubd_avx512f(auVar14,auVar20);
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x60);
        auVar11 = vmovdqa32_avx512f(auVar20);
        auVar12._0_4_ = (uint)(bVar2 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar14._0_4_
        ;
        bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar12._4_4_ = (uint)bVar4 * auVar11._4_4_ | (uint)!bVar4 * auVar14._4_4_;
        bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar12._8_4_ = (uint)bVar4 * auVar11._8_4_ | (uint)!bVar4 * auVar14._8_4_;
        bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar12._12_4_ = (uint)bVar4 * auVar11._12_4_ | (uint)!bVar4 * auVar14._12_4_;
        bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
        auVar12._16_4_ = (uint)bVar4 * auVar11._16_4_ | (uint)!bVar4 * auVar14._16_4_;
        bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
        auVar12._20_4_ = (uint)bVar4 * auVar11._20_4_ | (uint)!bVar4 * auVar14._20_4_;
        bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
        auVar12._24_4_ = (uint)bVar4 * auVar11._24_4_ | (uint)!bVar4 * auVar14._24_4_;
        bVar4 = (bool)((byte)(uVar7 >> 7) & 1);
        auVar12._28_4_ = (uint)bVar4 * auVar11._28_4_ | (uint)!bVar4 * auVar14._28_4_;
        auVar12._32_4_ =
             (uint)(bVar3 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar3 & 1) * auVar14._32_4_;
        bVar4 = (bool)(bVar3 >> 1 & 1);
        auVar12._36_4_ = (uint)bVar4 * auVar11._36_4_ | (uint)!bVar4 * auVar14._36_4_;
        bVar4 = (bool)(bVar3 >> 2 & 1);
        auVar12._40_4_ = (uint)bVar4 * auVar11._40_4_ | (uint)!bVar4 * auVar14._40_4_;
        bVar4 = (bool)(bVar3 >> 3 & 1);
        auVar12._44_4_ = (uint)bVar4 * auVar11._44_4_ | (uint)!bVar4 * auVar14._44_4_;
        bVar4 = (bool)(bVar3 >> 4 & 1);
        auVar12._48_4_ = (uint)bVar4 * auVar11._48_4_ | (uint)!bVar4 * auVar14._48_4_;
        bVar4 = (bool)(bVar3 >> 5 & 1);
        auVar12._52_4_ = (uint)bVar4 * auVar11._52_4_ | (uint)!bVar4 * auVar14._52_4_;
        bVar4 = (bool)(bVar3 >> 6 & 1);
        auVar12._56_4_ = (uint)bVar4 * auVar11._56_4_ | (uint)!bVar4 * auVar14._56_4_;
        auVar12._60_4_ =
             (uint)(bVar3 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar3 >> 7) * auVar14._60_4_;
        auVar10 = vextracti64x4_avx512f(auVar12,1);
        auVar11 = vpaddd_avx512f(auVar12,ZEXT3264(auVar10));
        auVar21 = vpaddd_avx(auVar11._0_16_,auVar11._16_16_);
        auVar8 = vpshufd_avx(auVar21,0xee);
        auVar21 = vpaddd_avx(auVar21,auVar8);
        auVar8 = vpshufd_avx(auVar21,0x55);
        auVar21 = vpaddd_avx(auVar21,auVar8);
        dVar16 = lgamma(41.0);
        dVar17 = lgamma(42.0);
        dVar18 = lgamma((double)(auVar21._0_4_ + 1));
        dVar19 = lgamma((double)(0x52 - auVar21._0_4_));
        exp(((dVar17 + dVar16) - dVar18) - dVar19);
        printf("%.81s\t%f\n",local_88);
        limit = limit + -1;
      }
    } while (limit != 0);
  }
  return;
}

Assistant:

void SamplePuzzles(int64_t limit) {
    void *table = MMapFile("grid.counts");
    void *index = MMapFile("grid.index");

    char grid[81];
    while (limit != 0) {
        size_t grid_id = random_uint(rng) % num_equivalence_classes;
        GetGrid(grid_id, index, table, grid);
        if (TdokuMinimize(false, true, grid)) {
            int num_clues = 0;
            for (char c : grid) num_clues += (c != '.');
            double weight = SamplingWeight(num_clues);
            printf("%.81s\t%f\n", grid, weight);
            limit--;
        }
    }
}